

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::PortReferenceSyntax::setChild
          (PortReferenceSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  ElementSelectSyntax *local_128;
  string local_100;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  PortReferenceSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->name).kind = (undefined2)local_28;
    (this->name).field_0x2 = local_28._2_1_;
    (this->name).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->name).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->name).info = local_20;
  }
  else {
    if (index != 1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
                 ,&local_c9);
      std::operator+(&local_a8,&local_c8,":");
      std::__cxx11::to_string(&local_100,0x27f6);
      std::operator+(&local_88,&local_a8,&local_100);
      std::operator+(&local_68,&local_88,": ");
      std::operator+(&local_48,&local_68,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_48);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_128 = (ElementSelectSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_128 = SyntaxNode::as<slang::syntax::ElementSelectSyntax>(pSVar1);
    }
    this->select = local_128;
  }
  return;
}

Assistant:

void PortReferenceSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.token(); return;
        case 1: select = child.node() ? &child.node()->as<ElementSelectSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}